

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FStateLabels *
FStateDefinitions::CreateStateLabelList(TArray<FStateDefine,_FStateDefine> *statelist)

{
  int *piVar1;
  FStateDefine *pFVar2;
  FStateLabels *pFVar3;
  ulong uVar4;
  FStateLabels *pFVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  size_t __nmemb;
  FStateLabels **ppFVar9;
  
  uVar8 = statelist->Count;
  while( true ) {
    uVar8 = uVar8 - 1;
    if ((int)uVar8 < 0) break;
    uVar6 = uVar8 & 0x7fffffff;
    pFVar2 = statelist->Array;
    if ((pFVar2[uVar6].Label.Index == 0) ||
       ((pFVar2[uVar6].State == (FState *)0x0 && (pFVar2[uVar6].Children.Count == 0)))) {
      TArray<FStateDefine,_FStateDefine>::Delete(statelist,uVar8);
    }
  }
  uVar8 = statelist->Count;
  __nmemb = (size_t)(int)uVar8;
  lVar7 = 0;
  if (__nmemb == 0) {
    pFVar3 = (FStateLabels *)0x0;
  }
  else {
    pFVar3 = (FStateLabels *)
             M_Malloc_Dbg(__nmemb * 0x18 + 8,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_states.cpp"
                          ,0x1de);
    pFVar3->NumLabels = uVar8;
    uVar4 = 0;
    if (0 < (int)uVar8) {
      uVar4 = (ulong)uVar8;
    }
    pFVar5 = pFVar3;
    for (; ppFVar9 = &pFVar5->Labels[0].Children, uVar4 * 0x28 - lVar7 != 0; lVar7 = lVar7 + 0x28) {
      piVar1 = (int *)((long)&(statelist->Array->Label).Index + lVar7);
      pFVar5->Labels[0].Label.Index = *piVar1;
      pFVar5->Labels[0].State = *(FState **)(piVar1 + 6);
      pFVar5 = CreateStateLabelList((TArray<FStateDefine,_FStateDefine> *)(piVar1 + 2));
      *ppFVar9 = pFVar5;
      pFVar5 = (FStateLabels *)ppFVar9;
    }
    qsort(pFVar3->Labels,__nmemb,0x18,labelcmp);
  }
  return pFVar3;
}

Assistant:

FStateLabels *FStateDefinitions::CreateStateLabelList(TArray<FStateDefine> & statelist)
{
	// First delete all empty labels from the list
	for (int i = statelist.Size() - 1; i >= 0; i--)
	{
		if (statelist[i].Label == NAME_None || (statelist[i].State == NULL && statelist[i].Children.Size() == 0))
		{
			statelist.Delete(i);
		}
	}

	int count = statelist.Size();

	if (count == 0)
	{
		return NULL;
	}
	FStateLabels *list = (FStateLabels*)M_Malloc(sizeof(FStateLabels)+(count-1)*sizeof(FStateLabel));
	list->NumLabels = count;

	for (int i=0;i<count;i++)
	{
		list->Labels[i].Label = statelist[i].Label;
		list->Labels[i].State = statelist[i].State;
		list->Labels[i].Children = CreateStateLabelList(statelist[i].Children);
	}
	qsort(list->Labels, count, sizeof(FStateLabel), labelcmp);
	return list;
}